

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

int Map_ManCheckConsistency(Map_Man_t *p)

{
  Map_Node_t *p_00;
  Map_Node_t *pMVar1;
  int iVar2;
  Map_NodeVec_t *p_01;
  char *__format;
  long lVar3;
  
  p_01 = Map_MappingDfs(p,0);
  for (lVar3 = 0; lVar3 < p_01->nSize; lVar3 = lVar3 + 1) {
    p_00 = p_01->pArray[lVar3];
    iVar2 = Map_NodeIsVar(p_00);
    if (iVar2 == 0) {
      iVar2 = Map_NodeIsConst(p_00);
      pMVar1 = p_00->pRepr;
      __format = "Constant 1 %d is a secondary node.\n";
      if (iVar2 == 0) {
        if (pMVar1 != (Map_Node_t *)0x0) {
          printf("Internal node %d is a secondary node.\n",(ulong)(uint)p_00->Num);
        }
        if (*(long *)(((ulong)p_00->p1 & 0xfffffffffffffffe) + 0x58) != 0) {
          printf("Internal node %d has first fanin that is a secondary node.\n",
                 (ulong)(uint)p_00->Num);
        }
        pMVar1 = *(Map_Node_t **)(((ulong)p_00->p2 & 0xfffffffffffffffe) + 0x58);
        __format = "Internal node %d has second fanin that is a secondary node.\n";
      }
    }
    else {
      pMVar1 = p_00->pRepr;
      __format = "Primary input %d is a secondary node.\n";
    }
    if (pMVar1 != (Map_Node_t *)0x0) {
      printf(__format,(ulong)(uint)p_00->Num);
    }
  }
  Map_NodeVecFree(p_01);
  return 1;
}

Assistant:

int Map_ManCheckConsistency( Map_Man_t * p )
{
    Map_Node_t * pNode;
    Map_NodeVec_t * pVec;
    int i;
    pVec = Map_MappingDfs( p, 0 );
    for ( i = 0; i < pVec->nSize; i++ )
    {
        pNode = pVec->pArray[i];
        if ( Map_NodeIsVar(pNode) )
        {
            if ( pNode->pRepr )
                printf( "Primary input %d is a secondary node.\n", pNode->Num );
        }
        else if ( Map_NodeIsConst(pNode) )
        {
            if ( pNode->pRepr )
                printf( "Constant 1 %d is a secondary node.\n", pNode->Num );
        }
        else
        {
            if ( pNode->pRepr )
                printf( "Internal node %d is a secondary node.\n", pNode->Num );
            if ( Map_Regular(pNode->p1)->pRepr )
                printf( "Internal node %d has first fanin that is a secondary node.\n", pNode->Num );
            if ( Map_Regular(pNode->p2)->pRepr )
                printf( "Internal node %d has second fanin that is a secondary node.\n", pNode->Num );
        }
    }
    Map_NodeVecFree( pVec );
    return 1;
}